

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

void check_leaf_list_backlinks(lyd_node *node,int op)

{
  lys_node *plVar1;
  lys_node *plVar2;
  ly_set *set_00;
  LY_ERR *pLVar3;
  uint local_48;
  uint local_44;
  uint32_t j;
  uint32_t i;
  ly_set *data;
  ly_set *set;
  lyd_node_leaf_list *leaf_list;
  lyd_node *iter;
  lyd_node *next;
  int op_local;
  lyd_node *node_local;
  
  leaf_list = (lyd_node_leaf_list *)node;
  if (((op != 0) && (op != 1)) && (op != 2)) {
    __assert_fail("(op == 0) || (op == 1) || (op == 2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x2ff,"void check_leaf_list_backlinks(struct lyd_node *, int)");
  }
  while (leaf_list != (lyd_node_leaf_list *)0x0) {
    if (((leaf_list->schema->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) &&
       (leaf_list->schema->child != (lys_node *)0x0)) {
      plVar1 = leaf_list->schema->child;
      for (local_44 = 0; local_44 < *(uint *)((long)&plVar1->name + 4); local_44 = local_44 + 1) {
        set_00 = lyd_find_instance((lyd_node *)leaf_list,
                                   *(lys_node **)(plVar1->dsc + (ulong)local_44 * 8));
        if (set_00 == (ly_set *)0x0) {
          pLVar3 = ly_errno_location();
          *pLVar3 = LY_EINT;
          ly_log(LY_LLERR,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                 ,0x317);
          return;
        }
        for (local_48 = 0; local_48 < set_00->number; local_48 = local_48 + 1) {
          plVar2 = (set_00->set).s[local_48];
          if (((((op != 0) && (*(short *)&plVar2->parent == 9)) &&
               (*(lyd_node_leaf_list **)&plVar2->nodetype == leaf_list)) ||
              ((op != 1 && (((ulong)plVar2->parent & 0x40) != 0)))) &&
             (*(byte *)&plVar2->dsc = *(byte *)&plVar2->dsc | 4, *(short *)&plVar2->parent == 9)) {
            *(undefined8 *)&plVar2->nodetype = 0;
          }
        }
        ly_set_free(set_00);
      }
    }
    iter = (lyd_node *)leaf_list->value_str;
    if ((leaf_list->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) {
      iter = (lyd_node *)0x0;
    }
    if (iter == (lyd_node *)0x0) {
      if (leaf_list == (lyd_node_leaf_list *)node) break;
      iter = leaf_list->next;
    }
    while ((iter == (lyd_node *)0x0 &&
           (leaf_list = (lyd_node_leaf_list *)leaf_list->parent, leaf_list->parent != node->parent))
          ) {
      iter = leaf_list->next;
    }
    leaf_list = (lyd_node_leaf_list *)iter;
  }
  if (node->parent != (lyd_node *)0x0) {
    node->parent->validity = '\x02';
  }
  lyd_wd_update_parents(node);
  return;
}

Assistant:

static void
check_leaf_list_backlinks(struct lyd_node *node, int op)
{
    struct lyd_node *next, *iter;
    struct lyd_node_leaf_list *leaf_list;
    struct ly_set *set, *data;
    uint32_t i, j;

    assert((op == 0) || (op == 1) || (op == 2));

    /* fix leafrefs */
    LY_TREE_DFS_BEGIN(node, next, iter) {
        /* the node is target of a leafref */
        if ((iter->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) && iter->schema->child) {
            set = (struct ly_set *)iter->schema->child;
            for (i = 0; i < set->number; i++) {
                data = lyd_find_instance(iter, set->set.s[i]);
                if (data) {
                    for (j = 0; j < data->number; j++) {
                        leaf_list = (struct lyd_node_leaf_list *)data->set.d[j];
                        if (((op != 0) && (leaf_list->value_type == LY_TYPE_LEAFREF) && (leaf_list->value.leafref == iter))
                                || ((op != 1) && (leaf_list->value_type & LY_TYPE_LEAFREF_UNRES))) {
                            /* invalidate the leafref, a change concerning it happened */
                            leaf_list->validity |= LYD_VAL_LEAFREF;
                            if (leaf_list->value_type == LY_TYPE_LEAFREF) {
                                /* remove invalid link */
                                leaf_list->value.leafref = NULL;
                            }
                        }
                    }
                    ly_set_free(data);
                } else {
                    LOGINT;
                    return;
                }
            }
        }
        LY_TREE_DFS_END(node, next, iter)
    }

    /* invalidate parent to make sure it will be checked in future validation */
    if (node->parent) {
        node->parent->validity = LYD_VAL_MAND;
    }

    /* update parent's default flag if needed */
    lyd_wd_update_parents(node);
}